

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandAbc9Sweep(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  int iVar2;
  Gia_Man_t *pNew;
  int *piVar3;
  char *pcVar4;
  char *pcVar5;
  Dch_Pars_t Pars;
  
  Dch_ManSetDefaultParams(&Pars);
  Extra_UtilGetoptReset();
LAB_0021ab7f:
  do {
    iVar1 = Extra_UtilGetopt(argc,argv,"WCStvh");
    iVar2 = globalUtilOptind;
    if (iVar1 == 0x43) {
      if (argc <= globalUtilOptind) {
        pcVar4 = "Command line switch \"-C\" should be followed by an integer.\n";
LAB_0021ac9c:
        Abc_Print(-1,pcVar4);
        goto LAB_0021aca6;
      }
      iVar1 = atoi(argv[globalUtilOptind]);
      Pars.nBTLimit = iVar1;
    }
    else if (iVar1 == 0x53) {
      if (argc <= globalUtilOptind) {
        pcVar4 = "Command line switch \"-S\" should be followed by an integer.\n";
        goto LAB_0021ac9c;
      }
      iVar1 = atoi(argv[globalUtilOptind]);
      Pars.nSatVarMax = iVar1;
    }
    else {
      if (iVar1 != 0x57) {
        piVar3 = &Pars.fSimulateTfo;
        if (iVar1 != 0x74) {
          if (iVar1 != 0x76) {
            if (iVar1 == -1) {
              if (pAbc->pGia != (Gia_Man_t *)0x0) {
                iVar2 = Gia_ManBoxNum(pAbc->pGia);
                if ((iVar2 == 0) || (pAbc->pGia->pAigExtra != (Gia_Man_t *)0x0)) {
                  iVar2 = Gia_ManBoxNum(pAbc->pGia);
                  if (iVar2 == 0) {
                    pNew = Gia_ManFraigSweepSimple(pAbc->pGia,&Pars);
                  }
                  else {
                    pNew = Gia_ManSweepWithBoxes(pAbc->pGia,&Pars,(void *)0x0,0,0,Pars.fVerbose,0);
                  }
                  Abc_FrameUpdateGia(pAbc,pNew);
                }
                else {
                  puts("Timing manager is given but there is no GIA of boxes.");
                }
                return 0;
              }
              pcVar4 = "Abc_CommandAbc9Sweep(): There is no AIG.\n";
              iVar2 = -1;
              goto LAB_0021ad54;
            }
            goto LAB_0021aca6;
          }
          piVar3 = &Pars.fVerbose;
        }
        *(byte *)piVar3 = (byte)*piVar3 ^ 1;
        goto LAB_0021ab7f;
      }
      if (argc <= globalUtilOptind) {
        pcVar4 = "Command line switch \"-W\" should be followed by an integer.\n";
        goto LAB_0021ac9c;
      }
      iVar1 = atoi(argv[globalUtilOptind]);
      Pars.nWords = iVar1;
    }
    globalUtilOptind = iVar2 + 1;
    if (iVar1 < 0) {
LAB_0021aca6:
      iVar2 = -2;
      Abc_Print(-2,"usage: &sweep [-WCS num] [-tvh]\n");
      Abc_Print(-2,"\t         performs SAT sweeping for AIG with boxes\n");
      Abc_Print(-2,"\t-W num : the max number of simulation words [default = %d]\n",
                (ulong)(uint)Pars.nWords);
      Abc_Print(-2,"\t-C num : the max number of conflicts at a node [default = %d]\n",
                (ulong)(uint)Pars.nBTLimit);
      Abc_Print(-2,"\t-S num : the max number of SAT variables [default = %d]\n",
                (ulong)(uint)Pars.nSatVarMax);
      pcVar5 = "yes";
      pcVar4 = "yes";
      if (Pars.fSimulateTfo == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-t     : toggle simulation of the TFO classes [default = %s]\n",pcVar4);
      if (Pars.fVerbose == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle verbose printout [default = %s]\n",pcVar5);
      pcVar4 = "\t-h     : print the command usage\n";
LAB_0021ad54:
      Abc_Print(iVar2,pcVar4);
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9Sweep( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Gia_Man_t * pTemp;
    Dch_Pars_t Pars, * pPars = &Pars;
    int c;
    Dch_ManSetDefaultParams( pPars );
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "WCStvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'W':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-W\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nWords = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nWords < 0 )
                goto usage;
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nBTLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nBTLimit < 0 )
                goto usage;
            break;
        case 'S':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-S\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nSatVarMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nSatVarMax < 0 )
                goto usage;
            break;
        case 't':
            pPars->fSimulateTfo ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Sweep(): There is no AIG.\n" );
        return 1;
    }
    if ( Gia_ManBoxNum(pAbc->pGia) && pAbc->pGia->pAigExtra == NULL )
    {
        printf( "Timing manager is given but there is no GIA of boxes.\n" );
        return 0;
    }
    if ( Gia_ManBoxNum(pAbc->pGia) )
        pTemp = Gia_ManSweepWithBoxes( pAbc->pGia, pPars, NULL, 0, 0, pPars->fVerbose, 0 );
    else
        pTemp = Gia_ManFraigSweepSimple( pAbc->pGia, pPars );
    Abc_FrameUpdateGia( pAbc, pTemp );
    return 0;

usage:
    Abc_Print( -2, "usage: &sweep [-WCS num] [-tvh]\n" );
    Abc_Print( -2, "\t         performs SAT sweeping for AIG with boxes\n" );
    Abc_Print( -2, "\t-W num : the max number of simulation words [default = %d]\n", pPars->nWords );
    Abc_Print( -2, "\t-C num : the max number of conflicts at a node [default = %d]\n", pPars->nBTLimit );
    Abc_Print( -2, "\t-S num : the max number of SAT variables [default = %d]\n", pPars->nSatVarMax );
    Abc_Print( -2, "\t-t     : toggle simulation of the TFO classes [default = %s]\n", pPars->fSimulateTfo? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle verbose printout [default = %s]\n", pPars->fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}